

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPointReaction::IfcStructuralPointReaction
          (IfcStructuralPointReaction *this)

{
  *(undefined ***)&(this->super_IfcStructuralReaction).field_0x158 = &PTR__Object_007331c0;
  *(undefined8 *)&this->field_0x160 = 0;
  *(char **)&this->field_0x168 = "IfcStructuralPointReaction";
  IfcStructuralReaction::IfcStructuralReaction
            (&this->super_IfcStructuralReaction,&PTR_construction_vtable_24__007b0788);
  *(undefined8 *)
   &(this->super_IfcStructuralReaction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject
       = 0x7b0658;
  *(undefined8 *)&(this->super_IfcStructuralReaction).field_0x158 = 0x7b0770;
  *(undefined8 *)
   &(this->super_IfcStructuralReaction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject
    .field_0x88 = 0x7b0680;
  (this->super_IfcStructuralReaction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x7b06a8;
  *(undefined8 *)
   &(this->super_IfcStructuralReaction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject
    .field_0xd0 = 0x7b06d0;
  *(undefined8 *)
   &(this->super_IfcStructuralReaction).super_IfcStructuralActivity.super_IfcProduct.field_0x100 =
       0x7b06f8;
  *(undefined8 *)&(this->super_IfcStructuralReaction).super_IfcStructuralActivity.field_0x138 =
       0x7b0720;
  *(undefined8 *)&(this->super_IfcStructuralReaction).super_IfcStructuralActivity.field_0x148 =
       0x7b0748;
  return;
}

Assistant:

IfcStructuralPointReaction() : Object("IfcStructuralPointReaction") {}